

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLinkMotorLinearDriveline.cpp
# Opt level: O2

void __thiscall
chrono::ChLinkMotorLinearDriveline::ConstraintsFetch_react
          (ChLinkMotorLinearDriveline *this,double factor)

{
  ChLinkMateGeneric::ConstraintsFetch_react((ChLinkMateGeneric *)this,factor);
  (*(((this->innerconstraint1lin).
      super___shared_ptr<chrono::ChShaftsBodyTranslation,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
    super_ChPhysicsItem).super_ChObj._vptr_ChObj[0x38])(factor);
  (*(((this->innerconstraint2lin).
      super___shared_ptr<chrono::ChShaftsBodyTranslation,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
    super_ChPhysicsItem).super_ChObj._vptr_ChObj[0x38])(factor);
  (*(((this->innerconstraint2rot).
      super___shared_ptr<chrono::ChShaftsBody,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
    super_ChPhysicsItem).super_ChObj._vptr_ChObj[0x38])(factor);
  return;
}

Assistant:

void ChLinkMotorLinearDriveline::ConstraintsFetch_react(double factor) {
    // First, inherit to parent class
    ChLinkMotorLinear::ConstraintsFetch_react(factor);

    innerconstraint1lin->ConstraintsFetch_react(factor);
    innerconstraint2lin->ConstraintsFetch_react(factor);
    innerconstraint2rot->ConstraintsFetch_react(factor);
}